

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetVersion(Btree *pBtree,int iVersion)

{
  BtShared *pBVar1;
  u8 *puVar2;
  u8 *aData;
  int rc;
  BtShared *pBt;
  int iVersion_local;
  Btree *pBtree_local;
  
  pBVar1 = pBtree->pBt;
  pBVar1->btsFlags = pBVar1->btsFlags & 0xffdf;
  if (iVersion == 1) {
    pBVar1->btsFlags = pBVar1->btsFlags | 0x20;
  }
  aData._4_4_ = sqlite3BtreeBeginTrans(pBtree,0,(int *)0x0);
  if (((aData._4_4_ == 0) &&
      (((puVar2 = pBVar1->pPage1->aData, (uint)puVar2[0x12] != (iVersion & 0xffU) ||
        ((uint)puVar2[0x13] != (iVersion & 0xffU))) &&
       (aData._4_4_ = sqlite3BtreeBeginTrans(pBtree,2,(int *)0x0), aData._4_4_ == 0)))) &&
     (aData._4_4_ = sqlite3PagerWrite(pBVar1->pPage1->pDbPage), aData._4_4_ == 0)) {
    puVar2[0x12] = (u8)iVersion;
    puVar2[0x13] = (u8)iVersion;
  }
  pBVar1->btsFlags = pBVar1->btsFlags & 0xffdf;
  return aData._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetVersion(Btree *pBtree, int iVersion){
  BtShared *pBt = pBtree->pBt;
  int rc;                         /* Return code */

  assert( iVersion==1 || iVersion==2 );

  /* If setting the version fields to 1, do not automatically open the
  ** WAL connection, even if the version fields are currently set to 2.
  */
  pBt->btsFlags &= ~BTS_NO_WAL;
  if( iVersion==1 ) pBt->btsFlags |= BTS_NO_WAL;

  rc = sqlite3BtreeBeginTrans(pBtree, 0, 0);
  if( rc==SQLITE_OK ){
    u8 *aData = pBt->pPage1->aData;
    if( aData[18]!=(u8)iVersion || aData[19]!=(u8)iVersion ){
      rc = sqlite3BtreeBeginTrans(pBtree, 2, 0);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          aData[18] = (u8)iVersion;
          aData[19] = (u8)iVersion;
        }
      }
    }
  }

  pBt->btsFlags &= ~BTS_NO_WAL;
  return rc;
}